

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O2

string * __thiscall
Catch::Matchers::Impl::MatcherUntypedBase::toString_abi_cxx11_
          (string *__return_storage_ptr__,MatcherUntypedBase *this)

{
  string asStack_38 [32];
  
  if ((this->m_cachedToString)._M_string_length == 0) {
    (*this->_vptr_MatcherUntypedBase[2])(asStack_38);
    std::__cxx11::string::operator=((string *)&this->m_cachedToString,asStack_38);
    std::__cxx11::string::~string(asStack_38);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_cachedToString);
  return __return_storage_ptr__;
}

Assistant:

std::string MatcherUntypedBase::toString() const {
            if( m_cachedToString.empty() )
                m_cachedToString = describe();
            return m_cachedToString;
        }